

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewChange.h
# Opt level: O2

void __thiscall
NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::AddOldVersion(NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *this,string *name,string *fileString,string *hashName)

{
  char cVar1;
  Logger *pLVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  string folderPath;
  ofstream file;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file,(this->path->_M_dataplus)._M_p,(allocator<char> *)&bStack_298);
  std::operator+(&folderPath,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                 "/versions/");
  std::__cxx11::string::~string((string *)&file);
  std::operator+(&bStack_298,&folderPath,hashName);
  std::ofstream::ofstream(&file,(string *)&bStack_298,_S_out);
  std::__cxx11::string::~string((string *)&bStack_298);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    pLVar2 = Logger::getInstance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,anon_var_dwarf_7672,(allocator<char> *)&bStack_298);
    Logger::LogError(pLVar2,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
  }
  poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&file);
  std::operator<<(poVar3,(string *)fileString);
  pLVar2 = Logger::getInstance();
  std::operator+(&local_278,anon_var_dwarf_768b,name);
  Logger::LogInformation(pLVar2,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::ofstream::~ofstream(&file);
  std::__cxx11::string::~string((string *)&folderPath);
  return;
}

Assistant:

virtual void AddOldVersion(string name, string fileString, string hashName) {
        string folderPath = string(this->path->data()) + "/versions/";

        ofstream file(folderPath + hashName);
        if (!file.is_open()) {
            Logger::getInstance()->LogError("Ошибка при открытии файла");
        }
        file << endl << fileString;
        Logger::getInstance()->LogInformation("Добавена версия файла " + name);
    }